

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
SmallArray<TypeFunctionSet_*,_128U>::~SmallArray(SmallArray<TypeFunctionSet_*,_128U> *this)

{
  TypeFunctionSet **ppTVar1;
  
  ppTVar1 = this->data;
  if (ppTVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppTVar1 != (TypeFunctionSet **)0x0) {
        (*(code *)NULLC::dealloc)(ppTVar1);
      }
    }
    else if (ppTVar1 != (TypeFunctionSet **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}